

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O1

bool __thiscall mjs::object::property::key_matches(property *this,gc_heap *h,wstring_view k)

{
  int iVar1;
  gc_string *pgVar2;
  ulong __n;
  bool bVar3;
  
  pgVar2 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference(&this->key_,h);
  __n = (ulong)pgVar2->length_;
  if (__n == k._M_len) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = wmemcmp((wchar_t *)(pgVar2 + 1),k._M_str,__n);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool key_matches(gc_heap& h, const std::wstring_view k) { return key_.dereference(h).view() == k; }